

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O0

bool vkt::sparse::anon_unknown_2::waitForFences
               (DeviceInterface *vk,VkDevice device,
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
               *fences)

{
  bool bVar1;
  int iVar2;
  reference this;
  RefBase<vk::Handle<(vk::HandleType)6>_> *this_00;
  Handle<(vk::HandleType)6> *pHVar3;
  __normal_iterator<const_de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>_>
  local_38;
  __normal_iterator<const_de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>_>
  local_30;
  const_iterator fenceSpIter;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  *fences_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  fenceSpIter._M_current =
       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)fences;
  local_30._M_current =
       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)
       std::
       vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
       ::begin(fences);
  while( true ) {
    local_38._M_current =
         (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)
         std::
         vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
         ::end(fenceSpIter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) {
      return true;
    }
    this = __gnu_cxx::
           __normal_iterator<const_de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>_>
           ::operator*(&local_30);
    this_00 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::operator*
                         (this)->super_RefBase<vk::Handle<(vk::HandleType)6>_>;
    pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*(this_00);
    iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,pHVar3,1,0xffffffffffffffff);
    if (iVar2 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>_>
    ::operator++(&local_30);
  }
  return false;
}

Assistant:

bool waitForFences (const DeviceInterface& vk, const VkDevice device, const std::vector<FenceSp>& fences)
{
	for (std::vector<FenceSp>::const_iterator fenceSpIter = fences.begin(); fenceSpIter != fences.end(); ++fenceSpIter)
	{
		if (vk.waitForFences(device, 1u, &(***fenceSpIter), VK_TRUE, ~0ull) != VK_SUCCESS)
			return false;
	}
	return true;
}